

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

bool __thiscall Minisat::Solver::propagateLit(Solver *this,Lit l,vec<Minisat::Lit> *implied)

{
  bool bVar1;
  CRef CVar2;
  byte bVar3;
  long lVar4;
  long lVar5;
  lbool local_2a;
  lbool local_29;
  
  cancelUntil(this,0,false);
  if (implied->data != (Lit *)0x0) {
    implied->sz = 0;
  }
  bVar3 = (byte)l.x & 1;
  local_29.value = (this->assigns).data[l.x >> 1].value ^ bVar3;
  bVar1 = lbool::operator!=(&local_29,(lbool)0x2);
  if (bVar1) {
    local_2a.value = bVar3 ^ (this->assigns).data[l.x >> 1].value;
    bVar1 = lbool::operator==(&local_2a,(lbool)0x1);
  }
  else {
    newDecisionLevel(this);
    uncheckedEnqueue(this,l,(this->trail_lim).sz,0xffffffff);
    lVar5 = (long)(this->trail).sz;
    CVar2 = propagate(this);
    lVar4 = lVar5 * 4;
    for (; lVar5 < (this->trail).sz; lVar5 = lVar5 + 1) {
      vec<Minisat::Lit>::push(implied,(Lit *)((long)&((this->trail).data)->x + lVar4));
      lVar4 = lVar4 + 4;
    }
    bVar1 = CVar2 != 0xffffffff;
    cancelUntil(this,0,false);
  }
  return bVar1;
}

Assistant:

bool Solver::propagateLit(Lit l, vec<Lit> &implied)
{
    cancelUntil(0);
    implied.clear();
    bool conflict = false;

    // literal is a unit clause
    if (value(l) != l_Undef) {
        return value(l) == l_False;
    }
    assert(value(l) == l_Undef);

    // propagate on a new decision level, to be able to roll back
    newDecisionLevel();
    uncheckedEnqueue(l, decisionLevel(), CRef_Undef);

    // collect trail literals
    int pre_size = trail.size();
    CRef cr = propagate();
    if (cr != CRef_Undef) conflict = true;
    for (int i = pre_size; i < trail.size(); i++) {
        implied.push(trail[i]);
    }
    cancelUntil(0);

    return conflict;
}